

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int archive_read_add_callback_data(archive *_a,void *client_data,uint iindex)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  
  iVar3 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_add_callback_data");
  if (iVar3 != -0x1e) {
    if (_a[1].current_codepage < iindex) {
      pcVar5 = "Invalid index specified.";
      iVar3 = 0x16;
    }
    else {
      uVar4 = _a[1].current_codepage + 1;
      _a[1].current_codepage = uVar4;
      pcVar5 = (char *)realloc(_a[1].read_data_block,(ulong)uVar4 * 0x18);
      if (pcVar5 != (char *)0x0) {
        _a[1].read_data_block = pcVar5;
        uVar2 = _a[1].current_codepage;
        uVar4 = uVar2 - 1;
        if (iindex < uVar4) {
          uVar7 = (ulong)uVar4;
          pcVar6 = pcVar5 + 0x10;
          do {
            *(undefined8 *)(pcVar6 + uVar7 * 0x18) =
                 *(undefined8 *)(pcVar6 + (ulong)(uVar2 - 2) * 0x18);
            pcVar1 = pcVar6 + uVar7 * 0x18 + -0x10;
            pcVar1[0] = -1;
            pcVar1[1] = -1;
            pcVar1[2] = -1;
            pcVar1[3] = -1;
            pcVar1[4] = -1;
            pcVar1[5] = -1;
            pcVar1[6] = -1;
            pcVar1[7] = -1;
            pcVar1[8] = -1;
            pcVar1[9] = -1;
            pcVar1[10] = -1;
            pcVar1[0xb] = -1;
            pcVar1[0xc] = -1;
            pcVar1[0xd] = -1;
            pcVar1[0xe] = -1;
            pcVar1[0xf] = -1;
            pcVar6 = pcVar6 + -0x18;
            uVar4 = uVar4 - 1;
          } while (iindex < uVar4);
        }
        *(void **)(pcVar5 + (ulong)iindex * 0x18 + 0x10) = client_data;
        pcVar5 = pcVar5 + (ulong)iindex * 0x18;
        pcVar5[0] = -1;
        pcVar5[1] = -1;
        pcVar5[2] = -1;
        pcVar5[3] = -1;
        pcVar5[4] = -1;
        pcVar5[5] = -1;
        pcVar5[6] = -1;
        pcVar5[7] = -1;
        pcVar5[8] = -1;
        pcVar5[9] = -1;
        pcVar5[10] = -1;
        pcVar5[0xb] = -1;
        pcVar5[0xc] = -1;
        pcVar5[0xd] = -1;
        pcVar5[0xe] = -1;
        pcVar5[0xf] = -1;
        return 0;
      }
      pcVar5 = "No memory.";
      iVar3 = 0xc;
    }
    archive_set_error(_a,iVar3,pcVar5);
  }
  return -0x1e;
}

Assistant:

int
archive_read_add_callback_data(struct archive *_a, void *client_data,
    unsigned int iindex)
{
	struct archive_read *a = (struct archive_read *)_a;
	void *p;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_add_callback_data");
	if (iindex > a->client.nodes) {
		archive_set_error(&a->archive, EINVAL,
			"Invalid index specified.");
		return ARCHIVE_FATAL;
	}
	p = realloc(a->client.dataset, sizeof(*a->client.dataset)
		* (++(a->client.nodes)));
	if (p == NULL) {
		archive_set_error(&a->archive, ENOMEM,
			"No memory.");
		return ARCHIVE_FATAL;
	}
	a->client.dataset = (struct archive_read_data_node *)p;
	for (i = a->client.nodes - 1; i > iindex; i--) {
		a->client.dataset[i].data = a->client.dataset[i-1].data;
		a->client.dataset[i].begin_position = -1;
		a->client.dataset[i].total_size = -1;
	}
	a->client.dataset[iindex].data = client_data;
	a->client.dataset[iindex].begin_position = -1;
	a->client.dataset[iindex].total_size = -1;
	return ARCHIVE_OK;
}